

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

void ponger_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  code *pcVar7;
  undefined1 *puVar8;
  int64_t eval_b;
  int64_t eval_b_1;
  int64_t eval_a;
  undefined1 auStack_598 [264];
  uv_stream_t *puStack_490;
  undefined1 auStack_480 [264];
  uv_stream_t *puStack_378;
  undefined1 auStack_368 [264];
  uv_stream_t *puStack_260;
  code *pcStack_258;
  undefined1 auStack_250 [264];
  undefined1 auStack_148 [264];
  uv_stream_t *puStack_40;
  long local_30;
  long local_28;
  undefined1 local_20 [16];
  
  local_20._0_8_ = nread;
  if (nread < 0) {
    local_30 = -0xfff;
    if (nread == -0xfff) {
      puStack_40 = (uv_stream_t *)0x170d82;
      puts("got EOF");
      puStack_40 = (uv_stream_t *)0x170d8a;
      free(buf->base);
      uv_close(stream,ponger_on_close);
      return;
    }
  }
  else {
    if (nread != 0) {
      lVar2 = 0;
      do {
        if (buf->base[lVar2] == 'I') {
          buf->base[lVar2] = 'O';
        }
        lVar2 = lVar2 + 1;
      } while (nread != lVar2);
    }
    puStack_40 = (uv_stream_t *)0x170cff;
    local_20 = uv_buf_init(buf->base);
    puStack_40 = (uv_stream_t *)0x170d13;
    pvVar3 = malloc(0xc0);
    if (pvVar3 == (void *)0x0) {
      puStack_40 = (uv_stream_t *)0x170da5;
      ponger_read_cb_cold_2();
    }
    else {
      local_30 = 0;
      puStack_40 = (uv_stream_t *)0x170d41;
      iVar1 = uv_write(pvVar3,stream,local_20,1,pinger_after_write);
      local_28 = (long)iVar1;
      if (local_30 == local_28) {
        return;
      }
    }
    puStack_40 = (uv_stream_t *)0x170db4;
    ponger_read_cb_cold_1();
  }
  puStack_40 = (uv_stream_t *)0x170dc3;
  ponger_read_cb_cold_3();
  puVar8 = auStack_250;
  puVar5 = auStack_250;
  pcStack_258 = (code *)0x170dd1;
  puStack_40 = stream;
  puVar4 = (undefined1 *)uv_default_loop();
  pcStack_258 = (code *)0x170de3;
  iVar1 = uv_pipe_init(puVar4,auStack_148,0);
  if (iVar1 == 0) {
    puVar4 = auStack_148;
    pcStack_258 = (code *)0x170dff;
    iVar1 = uv_pipe_bind(puVar4,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_00170ef0;
    pcStack_258 = (code *)0x170e0c;
    puVar4 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170e19;
    iVar1 = uv_pipe_init(puVar4,auStack_250,0);
    if (iVar1 != 0) goto LAB_00170ef5;
    pcStack_258 = (code *)0x170e30;
    iVar1 = uv_pipe_bind(auStack_250,"/tmp/uv-test-sock");
    if (iVar1 != -0x62) goto LAB_00170efa;
    puVar8 = auStack_148;
    pcStack_258 = (code *)0x170e4d;
    iVar1 = uv_listen(puVar8,0x1000,0);
    if (iVar1 != 0) goto LAB_00170eff;
    pcStack_258 = (code *)0x170e64;
    iVar1 = uv_listen(auStack_250,0x1000,0);
    if (iVar1 != -0x16) goto LAB_00170f04;
    pcVar7 = close_cb;
    pcStack_258 = (code *)0x170e84;
    uv_close(auStack_148,close_cb);
    pcStack_258 = (code *)0x170e8f;
    uv_close(auStack_250,close_cb);
    pcStack_258 = (code *)0x170e94;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170e9e;
    uv_run(puVar5,0);
    if (close_cb_called != 2) goto LAB_00170f09;
    pcStack_258 = (code *)0x170eac;
    pcVar7 = (code *)uv_default_loop();
    pcStack_258 = (code *)0x170ec0;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_258 = (code *)0x170eca;
    uv_run(pcVar7,0);
    pcStack_258 = (code *)0x170ecf;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_258 = (code *)0x170ed7;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_258 = (code *)0x170ee0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_258 = (code *)0x170ef0;
    run_test_pipe_bind_error_addrinuse_cold_1();
LAB_00170ef0:
    pcStack_258 = (code *)0x170ef5;
    run_test_pipe_bind_error_addrinuse_cold_2();
LAB_00170ef5:
    puVar8 = puVar4;
    pcStack_258 = (code *)0x170efa;
    run_test_pipe_bind_error_addrinuse_cold_3();
LAB_00170efa:
    pcStack_258 = (code *)0x170eff;
    run_test_pipe_bind_error_addrinuse_cold_4();
LAB_00170eff:
    puVar5 = puVar8;
    pcStack_258 = (code *)0x170f04;
    run_test_pipe_bind_error_addrinuse_cold_5();
LAB_00170f04:
    pcStack_258 = (code *)0x170f09;
    run_test_pipe_bind_error_addrinuse_cold_6();
    pcVar7 = (code *)stream;
LAB_00170f09:
    pcStack_258 = (code *)0x170f0e;
    run_test_pipe_bind_error_addrinuse_cold_7();
  }
  pcStack_258 = close_cb;
  run_test_pipe_bind_error_addrinuse_cold_8();
  if (puVar5 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return;
  }
  puStack_260 = (uv_stream_t *)run_test_pipe_bind_error_addrnotavail;
  close_cb_cold_1();
  puStack_378 = (uv_stream_t *)0x170f32;
  puStack_260 = (uv_stream_t *)pcVar7;
  uVar6 = uv_default_loop();
  puStack_378 = (uv_stream_t *)0x170f41;
  iVar1 = uv_pipe_init(uVar6,auStack_368,0);
  if (iVar1 == 0) {
    puStack_378 = (uv_stream_t *)0x170f5a;
    iVar1 = uv_pipe_bind(auStack_368,"/path/to/unix/socket/that/really/should/not/be/there");
    if (iVar1 != -0xd) goto LAB_00170fd1;
    puStack_378 = (uv_stream_t *)0x170f70;
    uv_close(auStack_368,close_cb);
    puStack_378 = (uv_stream_t *)0x170f75;
    uVar6 = uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170f7f;
    uv_run(uVar6,0);
    if (close_cb_called != 1) goto LAB_00170fd6;
    puStack_378 = (uv_stream_t *)0x170f8d;
    pcVar7 = (code *)uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170fa1;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_378 = (uv_stream_t *)0x170fab;
    uv_run(pcVar7,0);
    puStack_378 = (uv_stream_t *)0x170fb0;
    uVar6 = uv_default_loop();
    puStack_378 = (uv_stream_t *)0x170fb8;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      puStack_378 = (uv_stream_t *)0x170fc1;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_378 = (uv_stream_t *)0x170fd1;
    run_test_pipe_bind_error_addrnotavail_cold_1();
LAB_00170fd1:
    puStack_378 = (uv_stream_t *)0x170fd6;
    run_test_pipe_bind_error_addrnotavail_cold_2();
LAB_00170fd6:
    puStack_378 = (uv_stream_t *)0x170fdb;
    run_test_pipe_bind_error_addrnotavail_cold_3();
  }
  puStack_378 = (uv_stream_t *)run_test_pipe_bind_error_inval;
  run_test_pipe_bind_error_addrnotavail_cold_4();
  puStack_490 = (uv_stream_t *)0x170fed;
  puStack_378 = (uv_stream_t *)pcVar7;
  uVar6 = uv_default_loop();
  puStack_490 = (uv_stream_t *)0x170ffc;
  iVar1 = uv_pipe_init(uVar6,auStack_480,0);
  if (iVar1 == 0) {
    puStack_490 = (uv_stream_t *)0x171015;
    iVar1 = uv_pipe_bind(auStack_480,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_001710a5;
    puStack_490 = (uv_stream_t *)0x17102e;
    iVar1 = uv_pipe_bind(auStack_480,"/tmp/uv-test-sock2");
    if (iVar1 != -0x16) goto LAB_001710aa;
    puStack_490 = (uv_stream_t *)0x171044;
    uv_close(auStack_480,close_cb);
    puStack_490 = (uv_stream_t *)0x171049;
    uVar6 = uv_default_loop();
    puStack_490 = (uv_stream_t *)0x171053;
    uv_run(uVar6,0);
    if (close_cb_called != 1) goto LAB_001710af;
    puStack_490 = (uv_stream_t *)0x171061;
    pcVar7 = (code *)uv_default_loop();
    puStack_490 = (uv_stream_t *)0x171075;
    uv_walk(pcVar7,close_walk_cb,0);
    puStack_490 = (uv_stream_t *)0x17107f;
    uv_run(pcVar7,0);
    puStack_490 = (uv_stream_t *)0x171084;
    uVar6 = uv_default_loop();
    puStack_490 = (uv_stream_t *)0x17108c;
    iVar1 = uv_loop_close(uVar6);
    if (iVar1 == 0) {
      puStack_490 = (uv_stream_t *)0x171095;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_490 = (uv_stream_t *)0x1710a5;
    run_test_pipe_bind_error_inval_cold_1();
LAB_001710a5:
    puStack_490 = (uv_stream_t *)0x1710aa;
    run_test_pipe_bind_error_inval_cold_2();
LAB_001710aa:
    puStack_490 = (uv_stream_t *)0x1710af;
    run_test_pipe_bind_error_inval_cold_3();
LAB_001710af:
    puStack_490 = (uv_stream_t *)0x1710b4;
    run_test_pipe_bind_error_inval_cold_4();
  }
  puStack_490 = (uv_stream_t *)run_test_pipe_listen_without_bind;
  run_test_pipe_bind_error_inval_cold_5();
  puStack_490 = (uv_stream_t *)pcVar7;
  puVar4 = (undefined1 *)uv_default_loop();
  iVar1 = uv_pipe_init(puVar4,auStack_598,0);
  if (iVar1 == 0) {
    puVar4 = auStack_598;
    iVar1 = uv_listen(puVar4,0x1000,0);
    if (iVar1 != -0x16) goto LAB_00171165;
    uv_close(auStack_598,close_cb);
    puVar4 = (undefined1 *)uv_default_loop();
    uv_run(puVar4,0);
    if (close_cb_called == 1) {
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_0017116f;
    }
  }
  else {
    run_test_pipe_listen_without_bind_cold_1();
LAB_00171165:
    run_test_pipe_listen_without_bind_cold_2();
  }
  run_test_pipe_listen_without_bind_cold_3();
LAB_0017116f:
  run_test_pipe_listen_without_bind_cold_4();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar4,0);
  return;
}

Assistant:

static void ponger_read_cb(uv_stream_t* stream,
                           ssize_t nread,
                           const uv_buf_t* buf) {
  uv_buf_t writebuf;
  uv_write_t* req;
  int i;

  if (nread < 0) {
    ASSERT_EQ(nread, UV_EOF);

    puts("got EOF");
    free(buf->base);

    uv_close((uv_handle_t*) stream, ponger_on_close);

    return;
  }

  /* Echo back */
  for (i = 0; i < nread; i++) {
    if (buf->base[i] == 'I')
      buf->base[i] = 'O';
  }

  writebuf = uv_buf_init(buf->base, nread);
  req = malloc(sizeof(*req));
  ASSERT_NOT_NULL(req);
  ASSERT_EQ(0, uv_write(req, stream, &writebuf, 1, pinger_after_write));
}